

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O2

void __thiscall
glauber::WoodsSaxonNucleus::WoodsSaxonNucleus(WoodsSaxonNucleus *this,size_t A,double R,double a)

{
  piecewise_linear_distribution<double> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  undefined1 auVar1 [16];
  size_t __k;
  long lVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_XMM2_Qb;
  double local_38;
  double local_30;
  
  Nucleus::Nucleus(&this->super_Nucleus,A);
  this_00 = &this->woods_saxon_dist_;
  this_01 = &(this->woods_saxon_dist_)._M_param._M_den;
  (this->super_Nucleus)._vptr_Nucleus = (_func_int **)&PTR__WoodsSaxonNucleus_00143ab0;
  this->R_ = R;
  this->a_ = a;
  (this->woods_saxon_dist_)._M_param._M_int.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_int.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_int.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_den.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_den.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_den.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_den.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_den.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_m.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_m.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_m.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)this_00,0x3e9);
  std::vector<double,_std::allocator<double>_>::reserve(this_01,0x3e9);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = R;
  lVar2 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a;
  auVar1 = vfmadd132sd_fma(ZEXT816(0x4024000000000000),auVar5,auVar1);
  auVar6._0_8_ = auVar1._0_8_ / 1000.0;
  auVar6._8_8_ = auVar1._8_8_;
  auVar7 = auVar6;
  for (; lVar2 != 0x3e9; lVar2 = lVar2 + 1) {
    auVar4._0_8_ = (double)lVar2;
    auVar4._8_8_ = in_XMM2_Qb;
    auVar1 = vfmadd213sd_fma(auVar4,auVar7,ZEXT816(0));
    local_38 = auVar1._0_8_;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)this_00,&local_38);
    dVar3 = auVar6._0_8_ +
            (this_00->_M_param)._M_int.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar2];
    local_30 = dVar3 * dVar3;
    dVar3 = exp((dVar3 - R) / a);
    local_38 = local_30 / (dVar3 + 1.0);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_01,&local_38);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = auVar6._0_8_;
  }
  std::piecewise_linear_distribution<double>::param_type::_M_initialize(&this_00->_M_param);
  return;
}

Assistant:

WoodsSaxonNucleus::WoodsSaxonNucleus(std::size_t A, double R, double a)
    : Nucleus(A),
      R_(R),
      a_(a),
      woods_saxon_dist_(1000, 0., R + 10.*a,
        [R, a](double r) { return r*r/(1.+std::exp((r-R)/a)); })
{}